

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

bool __thiscall Klex::nextChar(Klex *this)

{
  int iVar1;
  Klex *this_local;
  
  iVar1 = fgetc((FILE *)this->file);
  this->currentChar = iVar1;
  skipComment(this);
  iVar1 = isalpha(this->currentChar);
  if ((iVar1 == 0) && (this->currentChar != 0x5f)) {
    iVar1 = isdigit(this->currentChar);
    if (iVar1 == 0) {
      if (this->currentChar == 0x27) {
        this->charClass = SINGLE_QUOTE;
      }
      else if (this->currentChar == 0x22) {
        this->charClass = DOUBLE_QUOTE;
      }
      else {
        this->charClass = OTHER;
      }
    }
    else {
      this->charClass = DIGIT;
    }
  }
  else {
    this->charClass = LETTER;
  }
  this->colNum = this->colNum + 1;
  return this->currentChar != -1;
}

Assistant:

bool Klex::nextChar() {
    currentChar = fgetc(file);

    skipComment();

    if(isalpha(currentChar) || currentChar == '_') {
        charClass = CharClass::LETTER;
    } else if(isdigit(currentChar)) {
        charClass = CharClass::DIGIT;
    } else if(currentChar == '\'') {
        charClass = CharClass::SINGLE_QUOTE;
    } else if(currentChar == '"') {
        charClass = CharClass::DOUBLE_QUOTE;
    } else {
        charClass = CharClass::OTHER;
    }

    colNum++;
    return currentChar != EOF;
}